

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.cpp
# Opt level: O3

btScalar btShortestAngleUpdate(btScalar accAngle,btScalar curAngle)

{
  float fVar1;
  float fVar2;
  
  fVar1 = fmodf(curAngle,6.2831855);
  fVar1 = fmodf(fVar1 + 6.2831855,6.2831855);
  fVar2 = fmodf(accAngle,6.2831855);
  fVar2 = fmodf(fVar2 + 6.2831855,6.2831855);
  fVar1 = fmodf(fVar1 - fVar2,6.2831855);
  fVar1 = fmodf(fVar1 + 6.2831855,6.2831855);
  fVar1 = fmodf(fVar1,6.2831855);
  if (-3.1415927 <= fVar1) {
    if (3.1415927 < fVar1) {
      fVar1 = fVar1 + -6.2831855;
    }
  }
  else {
    fVar1 = fVar1 + 6.2831855;
  }
  return (btScalar)
         (-(uint)(0.3 < ABS(fVar1)) & (uint)curAngle |
         ~-(uint)(0.3 < ABS(fVar1)) & (uint)(accAngle + fVar1));
}

Assistant:

static btScalar btShortestAngleUpdate(btScalar accAngle, btScalar curAngle)
{
	btScalar tol(0.3);
	btScalar result = btShortestAngularDistance(accAngle, curAngle);

	  if (btFabs(result) > tol)
		return curAngle;
	  else
		return accAngle + result;

	return curAngle;
}